

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::serialize<binlog::detail::VectorOutputStream>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               VectorOutputStream *ostream)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  int local_1c;
  
  uVar1 = s->_M_string_length;
  iVar3 = (int)uVar1;
  local_1c = iVar3;
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)ostream,
             (ostream->vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_1c);
  if (iVar3 != 0) {
    pcVar2 = (s->_M_dataplus)._M_p;
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              ((vector<char,std::allocator<char>> *)ostream,
               (ostream->vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,pcVar2,pcVar2 + (uVar1 & 0xffffffff));
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }